

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

BOOL Js::JavascriptProxy::DefineOwnPropertyDescriptor
               (RecyclableObject *obj,PropertyId propId,PropertyDescriptor *descriptor,
               bool throwOnError,ScriptContext *requestContext,PropertyOperationFlags flags)

{
  ImplicitCallFlags IVar1;
  ThreadContext *this;
  code *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  bool bVar5;
  Attributes attributes;
  BOOL BVar6;
  int iVar7;
  JavascriptProxy *this_00;
  RecyclableObject *pRVar8;
  JavascriptFunction *function;
  undefined4 *puVar9;
  Var pvVar10;
  PropertyRecord *pPVar11;
  undefined1 local_80 [8];
  PropertyDescriptor targetDescriptor;
  
  ThreadContext::ProbeStack(requestContext->threadContext,0xc00,requestContext,(PVOID)0x0);
  this = requestContext->threadContext;
  if ((this->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_External;
    return 0;
  }
  this_00 = VarTo<Js::JavascriptProxy,Js::RecyclableObject>(obj);
  pRVar8 = MarshalHandler(this_00,requestContext);
  if (pRVar8 == (RecyclableObject *)0x0) {
    bVar4 = ThreadContext::RecordImplicitException(this);
    if (!bVar4) {
      return 0;
    }
    JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea15,L"definePropertyDescriptor");
  }
  targetDescriptor._40_8_ = MarshalTarget(this_00,requestContext);
  function = GetMethodHelper(this_00,0x19c,requestContext);
  bVar4 = ScriptContext::IsHeapEnumInProgress(requestContext);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x6cc,"(!requestContext->IsHeapEnumInProgress())",
                                "!requestContext->IsHeapEnumInProgress()");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar9 = 0;
  }
  if (function == (JavascriptFunction *)0x0) {
    BVar6 = JavascriptOperators::DefineOwnPropertyDescriptor
                      ((RecyclableObject *)targetDescriptor._40_8_,propId,descriptor,throwOnError,
                       requestContext,flags);
    return BVar6;
  }
  pvVar10 = JavascriptOperators::FromPropertyDescriptor(descriptor,requestContext);
  targetDescriptor.originalVar.ptr = GetName(requestContext,propId);
  targetDescriptor.Setter.ptr = (void *)targetDescriptor._40_8_;
  bVar4 = this->reentrancySafeOrHandled;
  this->reentrancySafeOrHandled = true;
  local_80 = (undefined1  [8])this;
  targetDescriptor.Value.ptr = function;
  targetDescriptor.Getter.ptr = pRVar8;
  targetDescriptor._32_8_ = pvVar10;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar5 = ThreadContext::HasNoSideEffect(this,(RecyclableObject *)function,attributes);
  if (bVar5) {
    pRVar8 = (RecyclableObject *)
             DefineOwnPropertyDescriptor::anon_class_48_6_a93b9762::operator()
                       ((anon_class_48_6_a93b9762 *)local_80);
    bVar5 = ThreadContext::IsOnStack(pRVar8);
LAB_00ba9101:
    if (bVar5 != false) {
      this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
    }
  }
  else if ((this->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) != None) {
      pRVar8 = (RecyclableObject *)
               DefineOwnPropertyDescriptor::anon_class_48_6_a93b9762::operator()
                         ((anon_class_48_6_a93b9762 *)local_80);
      bVar5 = ThreadContext::IsOnStack(pRVar8);
      goto LAB_00ba9101;
    }
    IVar1 = this->implicitCallFlags;
    pRVar8 = (RecyclableObject *)
             DefineOwnPropertyDescriptor::anon_class_48_6_a93b9762::operator()
                       ((anon_class_48_6_a93b9762 *)local_80);
    this->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
  }
  else {
    this->implicitCallFlags = this->implicitCallFlags | ImplicitCall_Accessor;
    pRVar8 = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                   javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
               super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
  }
  this->reentrancySafeOrHandled = bVar4;
  BVar6 = JavascriptConversion::ToBoolean(pRVar8,requestContext);
  if (BVar6 == 0) {
    BVar6 = 0;
    if (throwOnError && (flags & PropertyOperation_StrictMode) != PropertyOperation_None) {
      pPVar11 = ScriptContext::GetPropertyName(requestContext,propId);
      JavascriptError::ThrowTypeErrorVar(requestContext,-0x7ff5e9d4,L"defineProperty",pPVar11 + 1);
    }
  }
  else {
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_80);
    uVar3 = targetDescriptor._40_8_;
    BVar6 = JavascriptOperators::GetOwnPropertyDescriptor
                      ((RecyclableObject *)targetDescriptor._40_8_,propId,requestContext,
                       (PropertyDescriptor *)local_80);
    iVar7 = (**(code **)(*(long *)uVar3 + 0x198))(uVar3);
    if (descriptor->configurableSpecified == true) {
      bVar4 = PropertyDescriptor::IsConfigurable(descriptor);
      bVar4 = !bVar4;
    }
    else {
      bVar4 = false;
    }
    if (BVar6 == 0) {
      if (!(bool)(iVar7 != 0 & (bVar4 ^ 1U))) goto LAB_00ba92ad;
    }
    else {
      BVar6 = JavascriptOperators::IsCompatiblePropertyDescriptor
                        (descriptor,(PropertyDescriptor *)local_80,iVar7 != 0,true,requestContext);
      if ((BVar6 == 0) ||
         ((bVar4 && (bVar4 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)local_80),
                    bVar4)))) {
LAB_00ba92ad:
        JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"defineProperty");
      }
    }
    BVar6 = 1;
  }
  return BVar6;
}

Assistant:

BOOL JavascriptProxy::DefineOwnPropertyDescriptor(RecyclableObject* obj, PropertyId propId, const PropertyDescriptor& descriptor, bool throwOnError, ScriptContext* requestContext, PropertyOperationFlags flags)
    {
        // #sec-proxy-object-internal-methods-and-internal-slots-defineownproperty-p-desc
        PROBE_STACK(requestContext, Js::Constants::MinStackDefault);

        // Reject implicit call
        ThreadContext* threadContext = requestContext->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }

        JavascriptProxy* proxy = VarTo<JavascriptProxy>(obj);

        //1. Assert: IsPropertyKey(P) is true.
        //2. Let handler be O.[[ProxyHandler]].
        RecyclableObject *handlerObj = proxy->MarshalHandler(requestContext);

        //3. If handler is null, then throw a TypeError exception.
        //4. Assert: Type(handler) is Object.
        if (handlerObj == nullptr)
        {
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnRevokedProxy, _u("definePropertyDescriptor"));
        }

        //5. Let target be O.[[ProxyTarget]].
        RecyclableObject *targetObj = proxy->MarshalTarget(requestContext);

        //6. Let trap be ? GetMethod(handler, "defineProperty").
        //7. If trap is undefined, then
        //a. Return ? target.[[DefineOwnProperty]](P, Desc).
        JavascriptFunction* defineOwnPropertyMethod = proxy->GetMethodHelper(PropertyIds::defineProperty, requestContext);

        Assert(!requestContext->IsHeapEnumInProgress());
        if (nullptr == defineOwnPropertyMethod)
        {
            return JavascriptOperators::DefineOwnPropertyDescriptor(targetObj, propId, descriptor, throwOnError, requestContext, flags);
        }

        //8. Let descObj be FromPropertyDescriptor(Desc).
        //9. Let booleanTrapResult be ToBoolean(? Call(trap, handler, << target, P, descObj >> )).
        //10. If booleanTrapResult is false, then return false.
        //11. Let targetDesc be ? target.[[GetOwnProperty]](P).
        Var descVar = JavascriptOperators::FromPropertyDescriptor(descriptor, requestContext);

        Var propertyName = GetName(requestContext, propId);

        Var definePropertyResult = threadContext->ExecuteImplicitCall(defineOwnPropertyMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, defineOwnPropertyMethod, CallInfo(CallFlags_Value, 4), handlerObj, targetObj, propertyName, descVar);
        });

        BOOL defineResult = JavascriptConversion::ToBoolean(definePropertyResult, requestContext);
        if (!defineResult)
        {
            if (throwOnError && flags & PropertyOperation_StrictMode)
            {
                JavascriptError::ThrowTypeErrorVar(
                    requestContext,
                    JSERR_ProxyHandlerReturnedFalse,
                    _u("defineProperty"),
                    requestContext->GetPropertyName(propId)->GetBuffer()
                );
            }
            return defineResult;
        }

        //12. Let extensibleTarget be ? IsExtensible(target).
        //13. If Desc has a[[Configurable]] field and if Desc.[[Configurable]] is false, then
        //    a.Let settingConfigFalse be true.
        //14. Else let settingConfigFalse be false.
        //15. If targetDesc is undefined, then
        //    a.If extensibleTarget is false, then throw a TypeError exception.
        //    b.If settingConfigFalse is true, then throw a TypeError exception.
        //16. Else targetDesc is not undefined,
        //    a.If IsCompatiblePropertyDescriptor(extensibleTarget, Desc, targetDesc) is false, then throw a TypeError exception.
        //    b.If settingConfigFalse is true and targetDesc.[[Configurable]] is true, then throw a TypeError exception.
        //17. Return true.
        PropertyDescriptor targetDescriptor;
        BOOL hasProperty = JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propId, requestContext, &targetDescriptor);
        BOOL isExtensible = targetObj->IsExtensible();
        BOOL settingConfigFalse = (descriptor.ConfigurableSpecified() && !descriptor.IsConfigurable());
        if (!hasProperty)
        {
            if (!isExtensible || settingConfigFalse)
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("defineProperty"));
            }
        }
        else
        {
            if (!JavascriptOperators::IsCompatiblePropertyDescriptor(descriptor, hasProperty? &targetDescriptor : nullptr, !!isExtensible, true, requestContext))
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("defineProperty"));
            }
            if (settingConfigFalse && targetDescriptor.IsConfigurable())
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("defineProperty"));
            }
        }
        return TRUE;
    }